

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImGui::ShadeVertsLinearColorGradientKeepAlpha
               (ImDrawList *draw_list,int vert_start_idx,int vert_end_idx,ImVec2 gradient_p0,
               ImVec2 gradient_p1,ImU32 col0,ImU32 col1)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  float fVar4;
  int b;
  int g;
  int r;
  float t;
  float local_5c;
  ImDrawVert *pIStack_58;
  float d;
  ImDrawVert *vert;
  ImDrawVert *vert_end;
  ImDrawVert *vert_start;
  ImVec2 IStack_38;
  float gradient_inv_length2;
  ImVec2 gradient_extent;
  ImU32 col1_local;
  ImU32 col0_local;
  int vert_end_idx_local;
  int vert_start_idx_local;
  ImDrawList *draw_list_local;
  ImVec2 gradient_p1_local;
  ImVec2 gradient_p0_local;
  
  gradient_extent.x = (float)col1;
  gradient_extent.y = (float)col0;
  draw_list_local = (ImDrawList *)gradient_p1;
  gradient_p1_local = gradient_p0;
  IStack_38 = ::operator-((ImVec2 *)&draw_list_local,&gradient_p1_local);
  fVar4 = ImLengthSqr(&stack0xffffffffffffffc8);
  vert_start._4_4_ = 1.0 / fVar4;
  vert = (draw_list->VtxBuffer).Data + vert_end_idx;
  pIStack_58 = (draw_list->VtxBuffer).Data + vert_start_idx;
  vert_end = pIStack_58;
  for (; pIStack_58 < vert; pIStack_58 = pIStack_58 + 1) {
    _r = ::operator-(&pIStack_58->pos,&gradient_p1_local);
    local_5c = ImDot((ImVec2 *)&r,&stack0xffffffffffffffc8);
    fVar4 = ImClamp<float>(local_5c * vert_start._4_4_,0.0,1.0);
    uVar1 = ImLerp<int>((uint)gradient_extent.y & 0xff,(uint)gradient_extent.x & 0xff,fVar4);
    iVar2 = ImLerp<int>((uint)gradient_extent.y >> 8 & 0xff,(uint)gradient_extent.x >> 8 & 0xff,
                        fVar4);
    iVar3 = ImLerp<int>((uint)gradient_extent.y >> 0x10 & 0xff,
                        (uint)gradient_extent.x >> 0x10 & 0xff,fVar4);
    pIStack_58->col = uVar1 | iVar2 << 8 | iVar3 << 0x10 | pIStack_58->col & 0xff000000;
  }
  return;
}

Assistant:

void ImGui::ShadeVertsLinearColorGradientKeepAlpha(ImDrawList* draw_list, int vert_start_idx, int vert_end_idx, ImVec2 gradient_p0, ImVec2 gradient_p1, ImU32 col0, ImU32 col1)
{
    ImVec2 gradient_extent = gradient_p1 - gradient_p0;
    float gradient_inv_length2 = 1.0f / ImLengthSqr(gradient_extent);
    ImDrawVert* vert_start = draw_list->VtxBuffer.Data + vert_start_idx;
    ImDrawVert* vert_end = draw_list->VtxBuffer.Data + vert_end_idx;
    for (ImDrawVert* vert = vert_start; vert < vert_end; vert++)
    {
        float d = ImDot(vert->pos - gradient_p0, gradient_extent);
        float t = ImClamp(d * gradient_inv_length2, 0.0f, 1.0f);
        int r = ImLerp((int)(col0 >> IM_COL32_R_SHIFT) & 0xFF, (int)(col1 >> IM_COL32_R_SHIFT) & 0xFF, t);
        int g = ImLerp((int)(col0 >> IM_COL32_G_SHIFT) & 0xFF, (int)(col1 >> IM_COL32_G_SHIFT) & 0xFF, t);
        int b = ImLerp((int)(col0 >> IM_COL32_B_SHIFT) & 0xFF, (int)(col1 >> IM_COL32_B_SHIFT) & 0xFF, t);
        vert->col = (r << IM_COL32_R_SHIFT) | (g << IM_COL32_G_SHIFT) | (b << IM_COL32_B_SHIFT) | (vert->col & IM_COL32_A_MASK);
    }
}